

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NotOperand.hpp
# Opt level: O1

string * __thiscall
ut11::detail::NotOperand<ut11::Operands::IsStringContainingCharacter>::GetErrorMessage<char[6]>
          (string *__return_storage_ptr__,
          NotOperand<ut11::Operands::IsStringContainingCharacter> *this,char (*actual) [6])

{
  size_t sVar1;
  string local_68;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"Expected Not failed: \n","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  sVar1 = strlen(*actual);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,actual,*actual + sVar1);
  Operands::IsStringContainingCharacter::GetErrorMessage(&local_48,&this->operand,&local_68);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetErrorMessage(const T& actual) const
			{
				std::string errorMessage("Expected Not failed: \n");
				errorMessage += operand.GetErrorMessage(actual);
				return errorMessage;
			}